

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined4 *__a,undefined4 *__b,undefined4 *__c)

{
  short sVar1;
  short sVar2;
  short sVar3;
  SeePiece __tmp;
  undefined8 uVar4;
  
  sVar1 = *(short *)(__a + 1);
  sVar2 = *(short *)(__b + 1);
  sVar3 = *(short *)(__c + 1);
  if (sVar1 < sVar2) {
    if (sVar2 < sVar3) {
      uVar4 = *__result;
      *(undefined2 *)((long)__result + 4) = *(undefined2 *)(__b + 1);
      *(undefined4 *)__result = *__b;
      *__b = (int)uVar4;
      *(short *)(__b + 1) = (short)((ulong)uVar4 >> 0x20);
      return;
    }
    uVar4 = *__result;
    if (sVar3 <= sVar1) {
      *(undefined2 *)((long)__result + 4) = *(undefined2 *)(__a + 1);
      *(undefined4 *)__result = *__a;
      *(short *)(__a + 1) = (short)((ulong)uVar4 >> 0x20);
      *__a = (int)uVar4;
      return;
    }
  }
  else {
    if (sVar1 < sVar3) {
      uVar4 = *__result;
      *(undefined2 *)((long)__result + 4) = *(undefined2 *)(__a + 1);
      *(undefined4 *)__result = *__a;
      *__a = (int)uVar4;
      *(short *)(__a + 1) = (short)((ulong)uVar4 >> 0x20);
      return;
    }
    uVar4 = *__result;
    if (sVar3 <= sVar2) {
      *(undefined2 *)((long)__result + 4) = *(undefined2 *)(__b + 1);
      *(undefined4 *)__result = *__b;
      *(short *)(__b + 1) = (short)((ulong)uVar4 >> 0x20);
      *__b = (int)uVar4;
      return;
    }
  }
  *(undefined2 *)((long)__result + 4) = *(undefined2 *)(__c + 1);
  *(undefined4 *)__result = *__c;
  *(short *)(__c + 1) = (short)((ulong)uVar4 >> 0x20);
  *__c = (int)uVar4;
  return;
}

Assistant:

inline bool operator<(const SeePiece& o) const { return score < o.score; }